

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void free_cache(cache *Cache)

{
  record *__ptr;
  long lVar1;
  int i;
  ulong uVar2;
  
  if (Cache->is_init == true) {
    Cache->is_init = false;
    lVar1 = 0;
    for (uVar2 = 0; __ptr = Cache->records, uVar2 < Cache->max_length; uVar2 = uVar2 + 1) {
      if ((&__ptr->valid)[lVar1] == true) {
        (*Cache->realse)((record *)((long)&__ptr->data + lVar1));
      }
      lVar1 = lVar1 + 0x18;
    }
    free(__ptr);
    free(Cache->stack);
    free_hashtable(&Cache->label_hash);
    return;
  }
  return;
}

Assistant:

void free_cache(cache*Cache){
  if(Cache->is_init==true){
    Cache->is_init = false;
    for(int i=0;i<Cache->max_length;i++){
      if(Cache->records[i].valid){
        // printf("1\n");
        Cache->realse(&Cache->records[i]);
      }
    }
    free(Cache->records);
    free(Cache->stack);
    free_hashtable(&Cache->label_hash);
  }
}